

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::BrInst::display(BrInst *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  ostream *in_RDI;
  
  display_op((OpCode)((ulong)in_RSI >> 0x20),in_RDI);
  display_cond((ConditionCode)((ulong)in_RSI >> 0x38),in_RDI);
  poVar1 = std::operator<<(in_RSI," ");
  std::operator<<(poVar1,(string *)(in_RDI + 0x10));
  return;
}

Assistant:

void BrInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " " << l;
}